

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

double __thiscall
PlanningUnitMADPDiscrete::GetJAOHProbs
          (PlanningUnitMADPDiscrete *this,JointBeliefInterface *jb,LIndex jaohI,LIndex p_jaohI,
          JointBeliefInterface *p_jb,JointPolicyDiscrete *jpol)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  LIndex LVar4;
  uint t;
  JointBeliefInterface *pJVar5;
  Index IVar6;
  Index t_00;
  ulong uVar7;
  undefined8 uVar8;
  E *this_00;
  PlanningUnitMADPDiscrete *pPVar9;
  Index *jaIs;
  Index *joIs;
  Index *jaIs_00;
  Index *joIs_00;
  JointBeliefInterface *pJVar10;
  double dVar11;
  Index aIStack_90 [2];
  LIndex LStack_88;
  Index aIStack_80 [2];
  JointPolicyDiscrete *local_78;
  LIndex local_70;
  JointBeliefInterface *local_68;
  undefined1 *local_60;
  uint local_54;
  LIndex local_50;
  double local_48;
  JointBeliefInterface *local_40;
  PlanningUnitMADPDiscrete *local_38;
  
  local_68 = p_jb;
  if ((((p_jb == (JointBeliefInterface *)0x0) && (p_jaohI == 0)) &&
      (jpol == (JointPolicyDiscrete *)0x0)) && ((this->_m_params)._m_JointBeliefs == true)) {
    aIStack_80[0] = 0x409112;
    aIStack_80[1] = 0;
    IVar6 = Globals::CastLIndexToIndex(jaohI);
    aIStack_80[0] = 0x40912b;
    aIStack_80[1] = 0;
    (**(code **)((long)*jb + 0xa8))
              (jb,(this->_m_jBeliefCache).
                  super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[IVar6]);
    aIStack_80[0] = 0x409133;
    aIStack_80[1] = 0;
    IVar6 = Globals::CastLIndexToIndex(jaohI);
    dVar11 = (this->_m_jaohProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[IVar6];
  }
  else {
    aIStack_80[0] = 0x409159;
    aIStack_80[1] = 0;
    local_78 = jpol;
    local_40 = jb;
    IVar6 = GetTimeStepForJAOHI(this,jaohI);
    aIStack_80[0] = 0x409167;
    aIStack_80[1] = 0;
    t_00 = GetTimeStepForJAOHI(this,p_jaohI);
    uVar7 = (ulong)IVar6 * 4 + 0xf & 0xfffffffffffffff0;
    jaIs = (Index *)((long)&local_78 - uVar7);
    joIs = (Index *)((long)jaIs - uVar7);
    local_70 = jaohI;
    local_60 = (undefined1 *)&local_78;
    local_54 = IVar6;
    local_50 = p_jaohI;
    local_38 = this;
    joIs[-2] = 0x4091b3;
    joIs[-1] = 0;
    GetJointActionObservationHistoryArrays(this,jaohI,IVar6,jaIs,joIs);
    pPVar9 = local_38;
    LVar4 = local_50;
    local_48 = (double)CONCAT44(local_48._4_4_,t_00);
    uVar7 = (ulong)t_00 * 4 + 0xf & 0xfffffffffffffff0;
    jaIs_00 = (Index *)((long)joIs - uVar7);
    joIs_00 = (Index *)((long)jaIs_00 - uVar7);
    if (local_50 != 0) {
      if (local_54 <= t_00) {
        return 0.0;
      }
      if (t_00 == 0) {
        joIs_00[-2] = 0x4093fe;
        joIs_00[-1] = 0;
        this_00 = (E *)__cxa_allocate_exception(0x28);
        joIs_00[-2] = 0x409410;
        joIs_00[-1] = 0;
        E::E(this_00," p_jaohI != 0 but t_p == 0 ");
        *(undefined1 **)(joIs_00 + -2) = &LAB_00409426;
        __cxa_throw(this_00,&E::typeinfo,E::~E);
      }
      joIs_00[-2] = 0x40920a;
      joIs_00[-1] = 0;
      GetJointActionObservationHistoryArrays(pPVar9,LVar4,t_00,jaIs_00,joIs_00);
      uVar7 = 0;
      do {
        if ((jaIs[uVar7] != jaIs_00[uVar7]) || (joIs[uVar7] != joIs_00[uVar7])) {
          joIs_00[-2] = 0x4092f4;
          joIs_00[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "GetJAOHProbs:: Warning pred. inconsistent with requested jaohI",0x3e);
          uVar8 = *(undefined8 *)(std::cerr + -0x18);
          joIs_00[-2] = 0x409308;
          joIs_00[-1] = 0;
          std::ios::widen((char)uVar8 + 'X');
          joIs_00[-2] = 0x409313;
          joIs_00[-1] = 0;
          std::ostream::put('X');
          joIs_00[-2] = 0x40931b;
          joIs_00[-1] = 0;
          std::ostream::flush();
          return 0.0;
        }
        uVar7 = uVar7 + 1;
      } while (t_00 != uVar7);
    }
    pPVar9 = local_38;
    pJVar10 = local_40;
    LVar4 = local_70;
    if (local_68 == (JointBeliefInterface *)0x0 && local_50 != 0) {
      if ((local_38->_m_params)._m_JointBeliefs == true) {
        joIs_00[-2] = 0x409261;
        joIs_00[-1] = 0;
        IVar6 = Globals::CastLIndexToIndex(LVar4);
        pJVar5 = local_40;
        pJVar10 = (pPVar9->_m_jBeliefCache).
                  super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[IVar6];
        pcVar1 = *(code **)((long)*local_40 + 0xa8);
        joIs_00[-2] = 0x40927b;
        joIs_00[-1] = 0;
        (*pcVar1)(pJVar5,pJVar10);
        joIs_00[-2] = 0x409283;
        joIs_00[-1] = 0;
        IVar6 = Globals::CastLIndexToIndex(LVar4);
        LVar4 = local_50;
        local_48 = (pPVar9->_m_jaohProbs).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[IVar6];
        joIs_00[-2] = 0x40929f;
        joIs_00[-1] = 0;
        IVar6 = Globals::CastLIndexToIndex(LVar4);
        return local_48 /
               (pPVar9->_m_jaohProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[IVar6];
      }
      lVar2 = *(long *)((long)*local_40 + -0xb8);
      local_68 = (JointBeliefInterface *)((long)&local_40->field_0x0 + lVar2);
      pcVar1 = *(code **)((long)*local_38->_m_madp + 0x50);
      joIs_00[-2] = 0x40934c;
      joIs_00[-1] = 0;
      uVar8 = (*pcVar1)();
      pPVar9 = local_38;
      pJVar10 = local_68;
      pcVar1 = *(code **)(*(long *)((long)&local_40->field_0x0 + lVar2) + 0x28);
      joIs_00[-2] = 0x409362;
      joIs_00[-1] = 0;
      (*pcVar1)(pJVar10,uVar8);
      joIs_00[-4] = 0;
      joIs_00[-3] = 0;
      joIs_00[-2] = 0;
      pJVar10 = local_40;
      joIs_00[-1] = 0;
      IVar6 = local_48._0_4_;
      joIs_00[-6] = 0x40938b;
      joIs_00[-5] = 0;
      GetJAOHProbsRecursively
                (pPVar9,pJVar10,jaIs_00,joIs_00,0,IVar6,*(LIndex *)(joIs_00 + -4),
                 *(JointPolicyDiscrete **)(joIs_00 + -2));
    }
    else if (local_68 == (JointBeliefInterface *)0x0) {
      lVar2 = *(long *)((long)*local_40 + -0xb8);
      plVar3 = (long *)&local_40->field_0x0;
      pcVar1 = *(code **)((long)*local_38->_m_madp + 0x50);
      joIs_00[-2] = 0x4093aa;
      joIs_00[-1] = 0;
      uVar8 = (*pcVar1)();
      pPVar9 = local_38;
      pcVar1 = *(code **)(*(long *)((long)&pJVar10->field_0x0 + lVar2) + 0x28);
      joIs_00[-2] = 0x4093bb;
      joIs_00[-1] = 0;
      (*pcVar1)((long)plVar3 + lVar2,uVar8);
    }
    else {
      pcVar1 = *(code **)((long)*local_40 + 0xa8);
      joIs_00[-2] = 0x4092d4;
      joIs_00[-1] = 0;
      (*pcVar1)(pJVar10);
    }
    t = local_54;
    IVar6 = local_48._0_4_;
    *(JointPolicyDiscrete **)(joIs_00 + -2) = local_78;
    *(LIndex *)(joIs_00 + -4) = local_50;
    joIs_00[-6] = 0x4093da;
    joIs_00[-5] = 0;
    dVar11 = GetJAOHProbsRecursively
                       (pPVar9,pJVar10,jaIs,joIs,IVar6,t,*(LIndex *)(joIs_00 + -4),
                        *(JointPolicyDiscrete **)(joIs_00 + -2));
  }
  return dVar11;
}

Assistant:

double 
PlanningUnitMADPDiscrete::GetJAOHProbs(
    //output args:
    JointBeliefInterface* jb, 
    //input args:
    LIndex jaohI, // the jaohI for which we want to know the probs
    LIndex p_jaohI, //=0 the GIVEN predecessor
    const JointBeliefInterface* p_jb,// = NULL, // the corresponding GIVEN jb of p
    const JointPolicyDiscrete * jpol// = NULL // the policy followed in
    ) const
{
    if(p_jaohI == 0 && p_jb == NULL && jpol==NULL) //the cacheable case
        if(_m_params.GetComputeJointBeliefs() )
        {
            //return the cached results...
            //
            //we have to make a copy (can't do jb = ..., because that would 
            //not be reflected in the calling function)
            *jb = *_m_jBeliefCache[CastLIndexToIndex(jaohI)]; 
            return (_m_jaohProbs[CastLIndexToIndex(jaohI)]);
        }
    //we can't get the cached result, so we have to compute.

    Index t = GetTimeStepForJAOHI(jaohI);
    Index t_p = GetTimeStepForJAOHI(p_jaohI);
    
    Index jaIs[t];
    Index joIs[t];
    GetJointActionObservationHistoryArrays(jaohI, t, jaIs, joIs);      
#if DEBUG_PUD_JAOHPROBS
    vector<Index> jaIsv,joIsv;
    JointActionObservationHistoryTree* jaoht = 
        GetJointActionObservationHistoryTree(jaohI);
    jaoht->GetJointActionObservationHistory()->
        GetJointActionObservationHistoryVectors(jaIsv, joIsv);
    
    cout << "t " << t << " " << jaohI  
         << "\njaIsv:" << SoftPrintVector(jaIsv)
         << ", joIsv:" << SoftPrintVector(joIsv)
         << ", jaoht:" << jaoht->GetJointActionObservationHistory()->SoftPrint()
         << endl;

    for(Index i=0;i!=t;++i)
        cout << "jaIs["<<i<<"]=" << jaIs[i] << " ";
    cout << endl;
#endif
    Index p_jaIs[t_p];
    Index p_joIs[t_p];
    
    if(p_jaohI != 0)
    {
        //check that p_jaohI is indeed a predecessor of jaohI, this consists of
        //two checks 1) the (quick) stage check::
        if (t_p >= t)
            return (0.0);

        if(t_p == 0)
            throw E(" p_jaohI != 0 but t_p == 0 ");

        //and 2) the consistency check
        GetJointActionObservationHistoryArrays(p_jaohI, t_p, p_jaIs, p_joIs); 
        for(Index tI=0; tI < t_p; tI++)
        {
            if ( jaIs[tI] == p_jaIs[tI] && 
                 joIs[tI] == p_joIs[tI]    )  
                ; //consistent
            else
            {
                cerr << "GetJAOHProbs:: Warning pred. inconsistent with requested jaohI" << endl;
                return (0.0); // p_jaohI is inconsistent with jaohI.
            }
        }
    }
    //p_jaIs[ t_p ... (t-1) ] contains the joint actions `still to be taken'
    //to get from p_jaohI to jaohI.

    if(p_jaohI != 0 && p_jb == NULL)
    {
        // a predecessor is specified, but without accompanying joint belief.
        // In this case we assume that a pure (deterministic) joint policy
        // that is consistent with p_jaohI has been followed.
        if(_m_params.GetComputeJointBeliefs() )
        {
            //if joint beliefs are cache use them:
            *jb = *_m_jBeliefCache[CastLIndexToIndex(jaohI)]; 
            double pr = _m_jaohProbs[CastLIndexToIndex(jaohI)];
            double p_pr = _m_jaohProbs[CastLIndexToIndex(p_jaohI)];
            double pr_cond = pr / p_pr;
            return pr_cond;
        }
        else
        {
            // Here we compute the joint belief corresponding to p_jaohI for
            // such a pure joint policy. by performing the belief update
            // starting from the first time step
            jb->Set( *GetMADPDI()->GetISD() );
            //*jb = *GetNewJointBeliefFromISD();
            GetJAOHProbsRecursively(jb, p_jaIs, p_joIs, 0, t_p, 
                    Globals::INITIAL_JAOHI );        
            //GetJAOHProbsRecursively(jb, p_jaIs, p_joIs, t0, t_p, jaoh0 );
        }
    }
    else if ( p_jb == NULL ) // and p_jaohI == 0
        jb->Set( *GetMADPDI()->GetISD() );
        //*jb = *GetNewJointBeliefFromISD();
    else
        *jb = *p_jb; //copy by value, we don't want to alter p_jb!

    double p = GetJAOHProbsRecursively(jb, 
            jaIs, joIs, t_p, t,
            //jaohI, 
            p_jaohI, 
            jpol);

    return(p);
}